

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O2

ChVector2<double> __thiscall
chrono::ChFile_ps::To_graph_from_page(ChFile_ps *this,ChVector2<double> *mv_p)

{
  ChVector2<double> *v_g;
  undefined1 (*in_RDI) [16];
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChVector2<double> CVar4;
  
  auVar1._8_8_ = 0x3fe0000000000000;
  auVar1._0_8_ = 0x3fe0000000000000;
  auVar1 = vmulpd_avx512vl(*(undefined1 (*) [16])(this->Gs_p).m_data,auVar1);
  auVar2._0_8_ = auVar1._0_8_ + (this->G_p).m_data[0];
  auVar2._8_8_ = auVar1._8_8_ + (this->G_p).m_data[1];
  auVar2 = vsubpd_avx(*(undefined1 (*) [16])mv_p->m_data,auVar2);
  auVar3._8_8_ = 0x3ff0000000000000;
  auVar3._0_8_ = 0x3ff0000000000000;
  auVar1 = vdivpd_avx(auVar3,*(undefined1 (*) [16])(this->Gz).m_data);
  auVar1 = vfmadd213pd_fma(auVar1,auVar2,*(undefined1 (*) [16])(this->Gc_g).m_data);
  *in_RDI = auVar1;
  CVar4.m_data[0] = auVar2._0_8_;
  CVar4.m_data[1] = auVar1._0_8_;
  return (ChVector2<double>)CVar4.m_data;
}

Assistant:

ChVector2<> ChFile_ps::To_graph_from_page(ChVector2<> mv_p) const {
    ChVector2<> v_g;
    ChVector2<> mGc_p;
    mGc_p.x() = G_p.x() + (Gs_p.x()) / 2;
    mGc_p.y() = G_p.y() + (Gs_p.y()) / 2;
    v_g.x() = (mv_p.x() - mGc_p.x()) * (1 / Gz.x()) + Gc_g.x();
    v_g.y() = (mv_p.y() - mGc_p.y()) * (1 / Gz.y()) + Gc_g.y();
    return v_g;
}